

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O2

S2CellUnion * __thiscall
S2CellUnion::Intersection(S2CellUnion *__return_storage_ptr__,S2CellUnion *this,S2CellId id)

{
  bool bVar1;
  __normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_> __x;
  ulong uVar2;
  S2CellId id_local;
  S2LogMessage local_38;
  
  (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2CellUnion_00304840
  ;
  (__return_storage_ptr__->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  id_local = id;
  bVar1 = Contains(this,id);
  if (bVar1) {
    std::vector<S2CellId,_std::allocator<S2CellId>_>::push_back
              (&__return_storage_ptr__->cell_ids_,&id_local);
  }
  else {
    uVar2 = ~id.id_ & id.id_ - 1;
    local_38._0_8_ = id.id_ - uVar2;
    __x = std::
          __lower_bound<__gnu_cxx::__normal_iterator<S2CellId_const*,std::vector<S2CellId,std::allocator<S2CellId>>>,S2CellId,__gnu_cxx::__ops::_Iter_less_val>
                    ((this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
    for (; (__x._M_current !=
            (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
            super__Vector_impl_data._M_finish && ((__x._M_current)->id_ <= uVar2 + id.id_));
        __x._M_current = __x._M_current + 1) {
      std::vector<S2CellId,_std::allocator<S2CellId>_>::push_back
                (&__return_storage_ptr__->cell_ids_,__x._M_current);
    }
  }
  bVar1 = IsNormalized(__return_storage_ptr__);
  if (!bVar1) {
    bVar1 = IsNormalized(this);
    if (bVar1) {
      S2LogMessage::S2LogMessage
                (&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_union.cc"
                 ,0x13a,kFatal,(ostream *)&std::cerr);
      std::operator<<(local_38.stream_,"Check failed: result.IsNormalized() || !IsNormalized() ");
      abort();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

S2CellUnion S2CellUnion::Intersection(S2CellId id) const {
  S2CellUnion result;
  if (Contains(id)) {
    result.cell_ids_.push_back(id);
  } else {
    vector<S2CellId>::const_iterator i = std::lower_bound(
        cell_ids_.begin(), cell_ids_.end(), id.range_min());
    S2CellId id_max = id.range_max();
    while (i != cell_ids_.end() && *i <= id_max)
      result.cell_ids_.push_back(*i++);
  }
  S2_DCHECK(result.IsNormalized() || !IsNormalized());
  return result;
}